

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atari8k.hpp
# Opt level: O0

void __thiscall
Atari2600::Cartridge::Atari8k::perform_bus_operation
          (Atari8k *this,BusOperation operation,uint16_t address,uint8_t *value)

{
  ushort uVar1;
  uint8_t *value_local;
  uint16_t address_local;
  BusOperation operation_local;
  Atari8k *this_local;
  
  uVar1 = address & 0x1fff;
  if ((address & 0x1000) != 0) {
    if (uVar1 == 0x1ff8) {
      this->rom_ptr_ = (this->super_BusExtender).rom_base_;
    }
    else if (uVar1 == 0x1ff9) {
      this->rom_ptr_ = (this->super_BusExtender).rom_base_ + 0x1000;
    }
    if ((int)operation < 5) {
      *value = this->rom_ptr_[(int)(uVar1 & 0xfff)];
    }
  }
  return;
}

Assistant:

void perform_bus_operation(CPU::MOS6502::BusOperation operation, uint16_t address, uint8_t *value) {
			address &= 0x1fff;
			if(!(address & 0x1000)) return;

			if(address == 0x1ff8) rom_ptr_ = rom_base_;
			else if(address == 0x1ff9) rom_ptr_ = rom_base_ + 4096;

			if(isReadOperation(operation)) {
				*value = rom_ptr_[address & 4095];
			}
		}